

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::shell_sort_1(int *a,int n,int gap)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  int local_28;
  int i;
  int t;
  int g;
  int j;
  int gap_local;
  int n_local;
  int *a_local;
  
  for (i = n / gap; 0 < i; i = i / gap) {
    for (local_28 = i; local_28 < n; local_28 = local_28 + 1) {
      iVar1 = a[local_28];
      t = local_28 - i;
      while( true ) {
        bVar2 = false;
        if (-1 < t) {
          bVar2 = iVar1 < a[t];
        }
        if (!bVar2) break;
        a[t + i] = a[t];
        t = t - i;
      }
      a[t + i] = iVar1;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

int shell_sort_1(int *a, int n, int gap = 2) {
        int j, g = n / gap, t;
        while (g > 0) {
            for (int i = g; i < n; i++) {
                t = a[i];
                for (j = i - g; j >= 0 && a[j] > t; j -= g) {
                    a[j + g] = a[j];
                }
                a[j + g] = t;
            }
            g /= gap;
        }
    }